

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O2

container_t * container_create(uint8_t typecode)

{
  array_container_t *result;
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,typecode);
  if (iVar1 == 3) {
    result = (array_container_t *)run_container_create();
  }
  else if (iVar1 == 2) {
    result = array_container_create();
  }
  else {
    result = (array_container_t *)bitset_container_create();
  }
  _assert_true((unsigned_long)result,"result",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
               ,0x43);
  return result;
}

Assistant:

static inline container_t *container_create(uint8_t typecode) {
    container_t *result = NULL;
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            result = bitset_container_create();
            break;
        case ARRAY_CONTAINER_TYPE:
            result = array_container_create();
            break;
        case RUN_CONTAINER_TYPE:
            result = run_container_create();
            break;
        default:
            assert(false);
            roaring_unreachable;
    }
    assert_non_null(result);
    return result;
}